

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireHandWithOneCardTest_tryPutCardsBack_Test::TestBody
          (SolitaireHandWithOneCardTest_tryPutCardsBack_Test *this)

{
  FunctionMocker<void_()> *this_00;
  StrictMock<solitaire::archivers::MoveCardsOperationSnapshotCreatorMock> *mock_obj;
  Cards *pCVar1;
  pointer *__ptr_2;
  Solitaire *this_01;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38;
  
  mock_obj = (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.moveCardsOperationSnapshotCreatorMock.rawPointer;
  this_00 = &(mock_obj->super_MoveCardsOperationSnapshotCreatorMock).gmock00_restoreSourcePile_18;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  local_38._M_dataplus._M_p = (pointer)this_00;
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1b6,"*moveCardsOperationSnapshotCreatorMock","restoreSourcePile()");
  this_01 = &(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  Solitaire::tryPutCardsBackFromHand(this_01);
  pCVar1 = Solitaire::getCardsInHand(this_01);
  local_48[0] = (internal)
                ((pCVar1->
                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                 )._M_impl.super__Vector_impl_data._M_start ==
                (pCVar1->
                super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
                ._M_impl.super__Vector_impl_data._M_finish);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,(AssertionResult *)"solitaire.getCardsInHand().empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x1b8,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardTest, tryPutCardsBack) {
    EXPECT_CALL(*moveCardsOperationSnapshotCreatorMock, restoreSourcePile());
    solitaire.tryPutCardsBackFromHand();
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}